

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_(AlphaNum *a)

{
  char *pcVar1;
  size_t sVar2;
  AlphaNum *in_RSI;
  string *in_RDI;
  allocator local_11;
  AlphaNum *local_10;
  
  local_10 = in_RSI;
  pcVar1 = strings::AlphaNum::data(in_RSI);
  sVar2 = strings::AlphaNum::size(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,sVar2,&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return in_RDI;
}

Assistant:

inline string StrCat(const AlphaNum& a) { return string(a.data(), a.size()); }